

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O0

void move_cursor_relative(wchar_t y,wchar_t x)

{
  int iVar1;
  int iVar2;
  wchar_t local_20;
  wchar_t local_1c;
  wchar_t vx;
  wchar_t vy;
  wchar_t kx;
  wchar_t ky;
  wchar_t x_local;
  wchar_t y_local;
  
  move_cursor_relative_map(y,x);
  iVar1 = y - Term->offset_y;
  if ((((-1 < iVar1) &&
       (iVar1 < ((Term->hgt - row_top_map[Term->sidebar_mode]) - row_bottom_map[Term->sidebar_mode])
                / (int)(uint)tile_height)) && (iVar2 = x - Term->offset_x, -1 < iVar2)) &&
     (iVar2 < ((Term->wid - col_map[Term->sidebar_mode]) + -1) / (int)(uint)tile_width)) {
    local_1c = iVar1 + row_top_map[Term->sidebar_mode];
    local_20 = iVar2 + col_map[Term->sidebar_mode];
    if (1 < tile_width) {
      local_20 = (tile_width - 1) * iVar2 + local_20;
    }
    if (1 < tile_height) {
      local_1c = (tile_height - 1) * iVar1 + local_1c;
    }
    Term_gotoxy(local_20,local_1c);
  }
  return;
}

Assistant:

void move_cursor_relative(int y, int x)
{
	int ky, kx;
	int vy, vx;

	/* Move the cursor on map sub-windows */
	move_cursor_relative_map(y, x);

	/* Location relative to panel */
	ky = y - Term->offset_y;

	/* Verify location */
	if ((ky < 0) || (ky >= SCREEN_HGT)) return;

	/* Location relative to panel */
	kx = x - Term->offset_x;

	/* Verify location */
	if ((kx < 0) || (kx >= SCREEN_WID)) return;

	/* Location in window */
	vy = ky + ROW_MAP;

	/* Location in window */
	vx = kx + COL_MAP;

	if (tile_width > 1)
		vx += (tile_width - 1) * kx;

	if (tile_height > 1)
		vy += (tile_height - 1) * ky;

	/* Go there */
	(void)Term_gotoxy(vx, vy);
}